

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O3

bool Diligent::LinuxFileSystem::PathExists(Char *strPath)

{
  int iVar1;
  string path;
  stat StatBuff;
  String local_c0;
  stat local_a0;
  
  std::__cxx11::string::string((string *)&local_c0,strPath,(allocator *)&local_a0);
  BasicFileSystem::CorrectSlashes(&local_c0,'\0');
  iVar1 = stat(local_c0._M_dataplus._M_p,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::PathExists(const Char* strPath)
{
    std::string path{strPath};
    CorrectSlashes(path);

    struct stat StatBuff;
    return (stat(path.c_str(), &StatBuff) == 0);
}